

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

void __thiscall VkSpecParser::parseCommands(VkSpecParser *this)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QArrayDataPointer<char16_t> local_e0;
  QStringView local_c8;
  QStringView local_b8;
  Command c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    cVar2 = QXmlStreamReader::atEnd();
    if (cVar2 != '\0') break;
    QXmlStreamReader::readNext();
    bVar3 = QXmlStreamReader::isEndElement(&this->m_reader);
    if (bVar3) {
      QVar4 = (QStringView)QXmlStreamReader::name();
      c.cmd.name.d.d = (Data *)0x0;
      local_e0.d = (Data *)0x0;
      local_e0.ptr = (char16_t *)0x0;
      local_e0.size = 0;
      c.cmd.name.d.ptr = L"commands";
      c.cmd.name.d.size = 8;
      local_c8.m_size = 8;
      local_c8.m_data = L"commands";
      local_b8 = QVar4;
      bVar3 = comparesEqual(&local_b8,&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&c);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
      if (bVar3) break;
    }
    bVar3 = QXmlStreamReader::isStartElement(&this->m_reader);
    if (bVar3) {
      QVar4 = (QStringView)QXmlStreamReader::name();
      c.cmd.name.d.d = (Data *)0x0;
      local_e0.d = (Data *)0x0;
      local_e0.ptr = (char16_t *)0x0;
      local_e0.size = 0;
      c.cmd.name.d.ptr = L"command";
      c.cmd.name.d.size = 7;
      local_c8.m_size = 7;
      local_c8.m_data = L"command";
      local_b8 = QVar4;
      bVar3 = comparesEqual(&local_b8,&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&c);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
      if (bVar3) {
        c.deviceLevel = true;
        c._97_7_ = 0xaaaaaaaaaaaaaa;
        c.args.d.ptr = (TypedName *)0xaaaaaaaaaaaaaaaa;
        c.args.d.size = -0x5555555555555556;
        c.cmd.typeSuffix.d.size = -0x5555555555555556;
        c.args.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        c.cmd.typeSuffix.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        c.cmd.typeSuffix.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        c.cmd.type.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        c.cmd.type.d.size = -0x5555555555555556;
        c.cmd.name.d.size = -0x5555555555555556;
        c.cmd.type.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        c.cmd.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        c.cmd.name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        parseCommand(&c,this);
        if (c.cmd.name.d.size != 0) {
          QList<VkSpecParser::Command>::emplaceBack<VkSpecParser::Command_const&>
                    (&this->m_commands,&c);
        }
        Command::~Command(&c);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VkSpecParser::parseCommands()
{
    // <commands comment="Vulkan command definitions">
    //   <command successcodes="VK_SUCCESS" ...>

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("commands"))
            return;
        if (m_reader.isStartElement() && m_reader.name() == QStringLiteral("command")) {
            const Command c = parseCommand();
            if (!c.cmd.name.isEmpty()) // skip aliases and commands for another api
                m_commands.append(c);
        }
    }
}